

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Dam_ManMultiAig_rec(Dam_Man_t *pMan,Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint *puVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  int iLit1;
  int iVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  uVar4 = (uint)*(undefined8 *)pObj;
  if ((int)uVar4 < 0) {
LAB_006fcbf3:
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x2f6,
                  "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar10 = uVar4 & 0x1fffffff;
  if (uVar10 == 0x1fffffff) goto LAB_006fcbf3;
  pGVar7 = p->pObjs;
  if ((pObj < pGVar7) || (pGVar7 + p->nObjs <= pObj)) {
LAB_006fcb96:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar6 = (int)((long)pObj - (long)pGVar7 >> 2) * -0x55555555;
  uVar9 = 0;
  if ((int)uVar6 < pMan->vNod2Set->nSize) {
    if ((int)uVar6 < 0) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar9 = pMan->vNod2Set->pArray[uVar6 & 0x7fffffff];
  }
  if (uVar9 == 0) {
    piVar11 = (int *)0x0;
  }
  else {
    if (((int)uVar9 < 0) || (pMan->vSetStore->nSize <= (int)uVar9)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar11 = pMan->vSetStore->pArray + uVar9;
  }
  if (piVar11 != (int *)0x0) {
    bVar3 = uVar10 == 0x1fffffff || (int)uVar4 < 0;
    if ((bVar3) ||
       ((uVar10 = (uint)((ulong)*(undefined8 *)pObj >> 0x20),
        (uVar10 & 0x1fffffff) <= (uVar4 & 0x1fffffff) &&
        (((bVar3 || ((uVar4 & 0x1fffffff) <= (uVar10 & 0x1fffffff))) ||
         ((p->pMuxes != (uint *)0x0 && (p->pMuxes[(int)uVar6] != 0)))))))) {
      __assert_fail("Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                    ,0x308,
                    "void Dam_ManMultiAig_rec(Dam_Man_t *, Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar5 = *piVar11;
    if (0 < iVar5) {
      lVar8 = 0;
      do {
        if (piVar11[lVar8 + 1] < 0) goto LAB_006fcb1a;
        uVar4 = (uint)piVar11[lVar8 + 1] >> 1;
        if (p->nObjs <= (int)uVar4) goto LAB_006fcb39;
        pGVar7 = p->pObjs;
        Dam_ManMultiAig_rec(pMan,pNew,p,pGVar7 + uVar4);
        if (piVar11[lVar8 + 1] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        uVar4 = pGVar7[uVar4].Value;
        if ((int)uVar4 < 0) goto LAB_006fcb58;
        piVar11[lVar8 + 1] = piVar11[lVar8 + 1] & 1U ^ uVar4;
        iVar5 = *piVar11;
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar5);
    }
    uVar4 = Gia_ManBalanceGate(pNew,pObj,p->vSuper,piVar11 + 1,iVar5);
    pObj->Value = uVar4;
    return;
  }
  Dam_ManMultiAig_rec(pMan,pNew,p,pObj + -(ulong)uVar10);
  Dam_ManMultiAig_rec(pMan,pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
  pGVar7 = p->pObjs;
  if ((pObj < pGVar7) || (pGVar7 + p->nObjs <= pObj)) goto LAB_006fcb96;
  puVar1 = p->pMuxes;
  if ((puVar1 == (uint *)0x0) ||
     (iVar5 = (int)((ulong)((long)pObj - (long)pGVar7) >> 2), puVar1[iVar5 * -0x55555555] == 0)) {
    uVar2 = *(ulong *)pObj;
    if (((uVar2 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar2 < 0) ||
       (uVar4 = (uint)(uVar2 >> 0x20), (uVar4 & 0x1fffffff) <= ((uint)uVar2 & 0x1fffffff))) {
      iVar5 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar4 = Gia_ManHashAnd(pNew,iVar5,iLit1);
    }
    else {
      if (((int)pObj[-(uVar2 & 0x1fffffff)].Value < 0) ||
         ((int)pObj[-(ulong)(uVar4 & 0x1fffffff)].Value < 0)) goto LAB_006fcb58;
      uVar4 = Gia_ManHashXorReal(pNew,pObj[-(uVar2 & 0x1fffffff)].Value ^ (uint)(uVar2 >> 0x1d) & 1,
                                 pObj[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
    }
  }
  else {
    if (puVar1 == (uint *)0x0) {
      pGVar7 = (Gia_Obj_t *)0x0;
    }
    else {
      if ((int)puVar1[iVar5 * -0x55555555] < 0) goto LAB_006fcb1a;
      uVar4 = puVar1[iVar5 * -0x55555555] >> 1;
      if (p->nObjs <= (int)uVar4) goto LAB_006fcb39;
      pGVar7 = pGVar7 + uVar4;
    }
    Dam_ManMultiAig_rec(pMan,pNew,p,pGVar7);
    iVar5 = Gia_ObjFanin2Copy(p,pObj);
    uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    if ((int)pObj[-(ulong)(uVar4 & 0x1fffffff)].Value < 0) {
LAB_006fcb58:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar10 = (uint)*(undefined8 *)pObj;
    if ((int)pObj[-(ulong)(uVar10 & 0x1fffffff)].Value < 0) goto LAB_006fcb58;
    uVar4 = Gia_ManHashMuxReal(pNew,iVar5,
                               uVar4 >> 0x1d & 1 ^ pObj[-(ulong)(uVar4 & 0x1fffffff)].Value,
                               pObj[-(ulong)(uVar10 & 0x1fffffff)].Value ^ uVar10 >> 0x1d & 1);
  }
  pObj->Value = uVar4;
  if (-1 < (int)uVar4) {
    if ((int)(uVar4 >> 1) < pNew->nObjs) {
      Gia_ObjSetGateLevel(pNew,pNew->pObjs + (uVar4 >> 1));
      return;
    }
LAB_006fcb39:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_006fcb1a:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

void Dam_ManMultiAig_rec( Dam_Man_t * pMan, Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int i, * pSet;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pSet = Dam_ObjSet(pMan, Gia_ObjId(p, pObj));
    if ( pSet == NULL )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
        {
            Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin2(p, pObj) );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    assert( Gia_ObjIsXor(pObj) || Gia_ObjIsAndReal(p, pObj) );
    // call recursively
    for ( i = 1; i <= pSet[0]; i++ )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(pSet[i]) );
        Dam_ManMultiAig_rec( pMan, pNew, p, pTemp );
        pSet[i] = Abc_LitNotCond( pTemp->Value, Abc_LitIsCompl(pSet[i]) );
    }
    // create balanced gate
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, pSet + 1, pSet[0] );
}